

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
* vkt::wsi::anon_unknown_0::createFences
            (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
             *__return_storage_ptr__,DeviceInterface *vkd,VkDevice device,size_t numFences)

{
  Unique<vk::Handle<(vk::HandleType)6>_> *ptr;
  long lVar1;
  bool bVar2;
  deUint64 local_68;
  DeviceInterface *pDStack_60;
  VkDevice local_58;
  VkAllocationCallbacks *pVStack_50;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> local_40;
  
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ::vector(__return_storage_ptr__,numFences,(allocator_type *)&local_68);
  lVar1 = 0;
  while (bVar2 = numFences != 0, numFences = numFences - 1, bVar2) {
    ptr = (Unique<vk::Handle<(vk::HandleType)6>_> *)operator_new(0x20);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_68,vkd,device,0,
                      (VkAllocationCallbacks *)0x0);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_device = local_58;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_allocator = pVStack_50;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal = local_68;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.deleter.m_deviceIface = pDStack_60;
    local_68 = 0;
    pDStack_60 = (DeviceInterface *)0x0;
    local_58 = (VkDevice)0x0;
    pVStack_50 = (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::SharedPtr(&local_40,ptr)
    ;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)
               ((long)&((__return_storage_ptr__->
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar1),&local_40);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::release(&local_40);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&local_68);
    lVar1 = lVar1 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<FenceSp> createFences (const DeviceInterface&	vkd,
							  const VkDevice			device,
							  size_t					numFences)
{
	vector<FenceSp> fences(numFences);

	for (size_t ndx = 0; ndx < numFences; ++ndx)
		fences[ndx] = FenceSp(new Unique<VkFence>(createFence(vkd, device)));

	return fences;
}